

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int sqlite3rbu_close(sqlite3rbu *p,char **pzErrmsg)

{
  sqlite3_file *psVar1;
  int iVar2;
  int rc2;
  sqlite3_file *pDb;
  int rc;
  char **pzErrmsg_local;
  sqlite3rbu *p_local;
  
  if (p == (sqlite3rbu *)0x0) {
    pDb._4_4_ = 7;
    *pzErrmsg = (char *)0x0;
  }
  else {
    if ((p->rc == 0) && (p->eStage == 1)) {
      iVar2 = sqlite3_exec(p->dbMain,"COMMIT",(sqlite3_callback)0x0,(void *)0x0,&p->zErrmsg);
      p->rc = iVar2;
    }
    if ((p->rc == 0) && (p->eStage == 4)) {
      psVar1 = p->pTargetFd->pReal;
      iVar2 = (*psVar1->pMethods->xSync)(psVar1,2);
      p->rc = iVar2;
    }
    rbuSaveState(p,p->eStage);
    if ((p->rc == 0) && (p->eStage == 1)) {
      iVar2 = sqlite3_exec(p->dbRbu,"COMMIT",(sqlite3_callback)0x0,(void *)0x0,&p->zErrmsg);
      p->rc = iVar2;
    }
    rbuObjIterFinalize(&p->objiter);
    if ((((p->zTarget == (char *)0x0) && (p->rc != 0)) && (p->dbRbu != (sqlite3 *)0x0)) &&
       ((iVar2 = sqlite3_exec(p->dbRbu,"DELETE FROM stat.rbu_state",(sqlite3_callback)0x0,
                              (void *)0x0,(char **)0x0), p->rc == 0x65 && (iVar2 != 0)))) {
      p->rc = iVar2;
    }
    sqlite3_close(p->dbRbu);
    sqlite3_close(p->dbMain);
    rbuDeleteVfs(p);
    sqlite3_free(p->aBuf);
    sqlite3_free(p->aFrame);
    rbuEditErrmsg(p);
    pDb._4_4_ = p->rc;
    if (pzErrmsg == (char **)0x0) {
      sqlite3_free(p->zErrmsg);
    }
    else {
      *pzErrmsg = p->zErrmsg;
    }
    sqlite3_free(p->zState);
    sqlite3_free(p);
  }
  return pDb._4_4_;
}

Assistant:

SQLITE_API int sqlite3rbu_close(sqlite3rbu *p, char **pzErrmsg){
  int rc;
  if( p ){

    /* Commit the transaction to the *-oal file. */
    if( p->rc==SQLITE_OK && p->eStage==RBU_STAGE_OAL ){
      p->rc = sqlite3_exec(p->dbMain, "COMMIT", 0, 0, &p->zErrmsg);
    }

    /* Sync the db file if currently doing an incremental checkpoint */
    if( p->rc==SQLITE_OK && p->eStage==RBU_STAGE_CKPT ){
      sqlite3_file *pDb = p->pTargetFd->pReal;
      p->rc = pDb->pMethods->xSync(pDb, SQLITE_SYNC_NORMAL);
    }

    rbuSaveState(p, p->eStage);

    if( p->rc==SQLITE_OK && p->eStage==RBU_STAGE_OAL ){
      p->rc = sqlite3_exec(p->dbRbu, "COMMIT", 0, 0, &p->zErrmsg);
    }

    /* Close any open statement handles. */
    rbuObjIterFinalize(&p->objiter);

    /* If this is an RBU vacuum handle and the vacuum has either finished
    ** successfully or encountered an error, delete the contents of the 
    ** state table. This causes the next call to sqlite3rbu_vacuum() 
    ** specifying the current target and state databases to start a new
    ** vacuum from scratch.  */
    if( rbuIsVacuum(p) && p->rc!=SQLITE_OK && p->dbRbu ){
      int rc2 = sqlite3_exec(p->dbRbu, "DELETE FROM stat.rbu_state", 0, 0, 0);
      if( p->rc==SQLITE_DONE && rc2!=SQLITE_OK ) p->rc = rc2;
    }

    /* Close the open database handle and VFS object. */
    sqlite3_close(p->dbRbu);
    sqlite3_close(p->dbMain);
    assert( p->szTemp==0 );
    rbuDeleteVfs(p);
    sqlite3_free(p->aBuf);
    sqlite3_free(p->aFrame);

    rbuEditErrmsg(p);
    rc = p->rc;
    if( pzErrmsg ){
      *pzErrmsg = p->zErrmsg;
    }else{
      sqlite3_free(p->zErrmsg);
    }
    sqlite3_free(p->zState);
    sqlite3_free(p);
  }else{
    rc = SQLITE_NOMEM;
    *pzErrmsg = 0;
  }
  return rc;
}